

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  size_t sVar1;
  ImFont *pIVar2;
  bool bVar3;
  char *local_c0;
  char *p;
  ImFontConfig font_cfg;
  void *data;
  ImWchar *pIStack_30;
  int data_size;
  ImWchar *glyph_ranges_local;
  ImFontConfig *font_cfg_template_local;
  char *pcStack_18;
  float size_pixels_local;
  char *filename_local;
  ImFontAtlas *this_local;
  
  data._4_4_ = 0;
  pIStack_30 = glyph_ranges;
  glyph_ranges_local = (ImWchar *)font_cfg_template;
  font_cfg_template_local._4_4_ = size_pixels;
  pcStack_18 = filename;
  filename_local = (char *)this;
  font_cfg.DstFont = (ImFont *)ImFileLoadToMemory(filename,"rb",(int *)((long)&data + 4),0);
  if (font_cfg.DstFont == (ImFont *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x4f6,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (glyph_ranges_local == (ImWchar *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)&p);
  }
  else {
    memcpy(&p,glyph_ranges_local,0x78);
  }
  local_c0 = pcStack_18;
  if ((char)font_cfg.RasterizerFlags == '\0') {
    sVar1 = strlen(pcStack_18);
    local_c0 = local_c0 + sVar1;
    while( true ) {
      bVar3 = false;
      if ((pcStack_18 < local_c0) && (bVar3 = false, local_c0[-1] != '/')) {
        bVar3 = local_c0[-1] != '\\';
      }
      if (!bVar3) break;
      local_c0 = local_c0 + -1;
    }
    snprintf((char *)&font_cfg.RasterizerFlags,0x20,"%s, %.0fpx",
             (double)font_cfg_template_local._4_4_,local_c0);
  }
  pIVar2 = AddFontFromMemoryTTF
                     (this,font_cfg.DstFont,data._4_4_,font_cfg_template_local._4_4_,
                      (ImFontConfig *)&p,pIStack_30);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    int data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT(0); // Could not load file.
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        snprintf(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, data_size, size_pixels, &font_cfg, glyph_ranges);
}